

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptconfig.c
# Opt level: O3

int poptReadConfigFiles(poptContext con,char *paths)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 *puVar7;
  char *pcVar8;
  char ***in_RCX;
  undefined8 *extraout_RDX;
  int iVar9;
  poptContext ppVar10;
  long lVar11;
  poptContext ppVar12;
  uint uVar13;
  int ac;
  int iStack_16c;
  void *pvStack_168;
  stat sStack_160;
  undefined8 uStack_d0;
  char *pcStack_c0;
  glob_t gStack_b0;
  poptContext ppStack_68;
  int local_44;
  void *local_40;
  poptContext local_38;
  
  if (paths == (char *)0x0) {
    return 0;
  }
  pcVar8 = paths;
  sVar5 = strlen(paths);
  pcVar6 = (char *)(sVar5 + 1);
  local_38 = (poptContext)malloc((size_t)pcVar6);
  if (local_38 != (poptContext)0x0) {
    strcpy((char *)local_38,paths);
    if ((char)local_38->optionStack[0].argc == '\0') {
      uVar13 = 0;
    }
    else {
      uVar13 = 0;
      ppVar10 = local_38;
      do {
        local_40 = (void *)0x0;
        local_44 = 0;
        pcVar6 = strchr((char *)ppVar10,0x3a);
        if ((pcVar6 == (char *)0x0) || (*pcVar6 != ':')) {
          sVar5 = strlen((char *)ppVar10);
          ppVar12 = (poptContext)((long)&ppVar10->optionStack[0].argc + sVar5);
        }
        else {
          ppVar12 = (poptContext)(pcVar6 + 1);
          *pcVar6 = '\0';
        }
        poptGlob(ppVar10,(char *)&local_44,(int *)&local_40,in_RCX);
        if (0 < local_44) {
          lVar11 = 0;
          do {
            pcVar6 = *(char **)((long)local_40 + lVar11 * 8);
            iVar3 = poptSaneFile(pcVar6);
            if (iVar3 != 0) {
              uVar4 = poptReadConfigFile(con,pcVar6);
              uVar2 = uVar13;
              if (uVar13 == 0) {
                uVar2 = uVar4;
              }
              in_RCX = (char ***)(ulong)uVar2;
              if (uVar4 != 0) {
                uVar13 = uVar2;
              }
              free(*(void **)((long)local_40 + lVar11 * 8));
              *(undefined8 *)((long)local_40 + lVar11 * 8) = 0;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < local_44);
        }
        free(local_40);
        ppVar10 = ppVar12;
      } while ((char)ppVar12->optionStack[0].argc != '\0');
    }
    free(local_38);
    return uVar13;
  }
  poptReadConfigFiles_cold_1();
  ppStack_68 = con;
  iVar3 = glob_pattern_p(pcVar6,0);
  if (iVar3 != 0) {
    iVar9 = 0;
    iVar3 = glob(pcVar6,0,poptGlob_error,&gStack_b0);
    if (iVar3 == 3) {
      *extraout_RDX = 0;
      pcVar8[0] = '\0';
      pcVar8[1] = '\0';
      pcVar8[2] = '\0';
      pcVar8[3] = '\0';
    }
    else {
      iVar9 = -0x10;
      if (iVar3 == 0) {
        if (pcVar8 != (char *)0x0) {
          *(undefined4 *)pcVar8 = (undefined4)gStack_b0.gl_pathc;
          gStack_b0.gl_pathc = 0;
        }
        if (extraout_RDX != (undefined8 *)0x0) {
          *extraout_RDX = gStack_b0.gl_pathv;
          gStack_b0.gl_pathv = (char **)0x0;
        }
        globfree(&gStack_b0);
        iVar9 = 0;
      }
    }
    return iVar9;
  }
  if (pcVar8 != (char *)0x0) {
    pcVar8[0] = '\x01';
    pcVar8[1] = '\0';
    pcVar8[2] = '\0';
    pcVar8[3] = '\0';
  }
  if (extraout_RDX == (undefined8 *)0x0) {
    return 0;
  }
  puVar7 = (undefined8 *)calloc(2,8);
  *extraout_RDX = puVar7;
  if (puVar7 == (undefined8 *)0x0) {
    return 0;
  }
  sVar5 = strlen(pcVar6);
  ppVar10 = (poptContext)(sVar5 + 1);
  pcVar8 = (char *)malloc((size_t)ppVar10);
  if (pcVar8 != (char *)0x0) {
    strcpy(pcVar8,pcVar6);
    *puVar7 = pcVar8;
    return 0;
  }
  poptGlob_cold_1();
  uStack_d0 = 0;
  if (ppVar10->appName == (char *)0x0) {
    return 0;
  }
  pcStack_c0 = pcVar6;
  iVar3 = poptReadConfigFile(ppVar10,"/usr/local/etc/popt");
  if (iVar3 == 0) {
    iVar3 = stat("/usr/local/etc/popt.d",&sStack_160);
    if ((iVar3 == 0) && ((sStack_160.st_mode & 0xf000) == 0x4000)) {
      pvStack_168 = (void *)0x0;
      iStack_16c = 0;
      iVar3 = poptGlob((poptContext)"/usr/local/etc/popt.d/*",(char *)&iStack_16c,
                       (int *)&pvStack_168,in_RCX);
      if (iVar3 != 0) {
        return iVar3;
      }
      if (iStack_16c < 1) {
        iVar3 = 0;
      }
      else {
        lVar11 = 1;
        do {
          pcVar6 = *(char **)((long)pvStack_168 + lVar11 * 8 + -8);
          iVar3 = poptSaneFile(pcVar6);
          if (iVar3 == 0) {
            iVar3 = 0;
          }
          else {
            iVar3 = poptReadConfigFile(ppVar10,pcVar6);
            free(*(void **)((long)pvStack_168 + lVar11 * 8 + -8));
            *(undefined8 *)((long)pvStack_168 + lVar11 * 8 + -8) = 0;
          }
        } while ((iVar3 == 0) && (bVar1 = lVar11 < iStack_16c, lVar11 = lVar11 + 1, bVar1));
      }
      free(pvStack_168);
      if (iVar3 != 0) {
        return iVar3;
      }
    }
    pcVar6 = getenv("HOME");
    iVar3 = 0;
    if (pcVar6 != (char *)0x0) {
      sVar5 = strlen(pcVar6);
      pcVar8 = (char *)malloc(sVar5 + 0x14);
      if (pcVar8 == (char *)0x0) {
        iVar3 = -0x10;
      }
      else {
        pcVar6 = stpcpy(pcVar8,pcVar6);
        builtin_strncpy(pcVar6,"/.popt",7);
        iVar3 = poptReadConfigFile(ppVar10,pcVar8);
        free(pcVar8);
      }
    }
    return iVar3;
  }
  return iVar3;
}

Assistant:

int poptReadConfigFiles(poptContext con, const char * paths)
{
    char * buf = (paths ? xstrdup(paths) : NULL);
    const char * p;
    char * pe;
    int rc = 0;		/* assume success */

    for (p = buf; p != NULL && *p != '\0'; p = pe) {
	const char ** av = NULL;
	int ac = 0;
	int i;
	int xx;

	/* locate start of next path element */
	pe = strchr(p, ':');
	if (pe != NULL && *pe == ':')
	    *pe++ = '\0';
	else
	    pe = (char *) (p + strlen(p));

	xx = poptGlob(con, p, &ac, &av);

	/* work-off each resulting file from the path element */
	for (i = 0; i < ac; i++) {
	    const char * fn = av[i];
	    if (!poptSaneFile(fn))
		continue;
	    xx = poptReadConfigFile(con, fn);
	    if (xx && rc == 0)
		rc = xx;
	    free((void *)av[i]);
	    av[i] = NULL;
	}
	free(av);
	av = NULL;
    }

    if (buf)
	free(buf);

    return rc;
}